

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O0

void __thiscall
chrono::ChFrameMoving<double>::SetWacc_loc(ChFrameMoving<double> *this,ChVector<double> *al)

{
  ChQuaternion<double> local_f8;
  ChQuaternion<double> local_d8;
  ChQuaternion<double> local_b8;
  ChQuaternion<double> local_98;
  ChQuaternion<double> local_78;
  ChQuaternion<double> local_58;
  ChQuaternion<double> local_38;
  ChVector<double> *local_18;
  ChVector<double> *al_local;
  ChFrameMoving<double> *this_local;
  
  local_18 = al;
  al_local = (ChVector<double> *)this;
  ChQuaternion<double>::GetConjugate(&local_98,&(this->super_ChFrame<double>).coord.rot);
  ChQuaternion<double>::operator%(&local_78,&(this->coord_dt).rot,&local_98);
  ChQuaternion<double>::operator%(&local_58,&local_78,&(this->coord_dt).rot);
  ChQuaternion<double>::ChQuaternion(&local_f8,0.0,local_18);
  ChQuaternion<double>::operator%(&local_d8,&(this->super_ChFrame<double>).coord.rot,&local_f8);
  ChQuaternion<double>::operator*(&local_b8,&local_d8,0.5);
  ChQuaternion<double>::operator+(&local_38,&local_58,&local_b8);
  ChQuaternion<double>::operator=(&(this->coord_dtdt).rot,&local_38);
  return;
}

Assistant:

virtual void SetWacc_loc(const ChVector<Real>& al) {
        // q_dtdt = q_dt * q' * q_dt + 1/2 * q * (0,al)
        coord_dtdt.rot = (coord_dt.rot % this->coord.rot.GetConjugate() % coord_dt.rot) +
                         (this->coord.rot % ChQuaternion<Real>(0, al) * (Real)0.5);
    }